

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O1

void test_cio_write_buffer_split_and_append_empty_list(void)

{
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh_to_append;
  cio_write_buffer wbh_to_split;
  undefined8 **local_98;
  undefined1 **local_90;
  char *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined8 **local_70;
  char *local_68;
  undefined8 local_60;
  undefined1 **local_58;
  undefined1 *local_50;
  UNITY_INT local_48;
  UNITY_INT UStack_40;
  undefined8 **local_38;
  undefined8 **local_30;
  undefined8 local_28;
  UNITY_INT UStack_20;
  
  local_50 = (undefined1 *)&local_98;
  local_78 = (undefined1 *)&local_98;
  local_38 = &local_38;
  local_28 = 0;
  UStack_20 = 0;
  local_98 = &local_58;
  local_90 = &local_78;
  local_68 = "HELLO";
  local_60 = 6;
  local_88 = "World";
  local_80 = 6;
  local_48 = 2;
  UStack_40 = 0xc;
  local_70 = local_98;
  local_58 = local_90;
  local_30 = local_38;
  UnityAssertEqualNumber
            (0,0,"Number of elements in splitted list not correct!",0x17b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,UStack_20,"Total size of splitted list not correct!",0x17c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,local_48,"Number of elements in appended list not correct!",0x17d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0xc,UStack_40,"Total size of appended list not correct!",0x17e,UNITY_DISPLAY_STYLE_INT)
  ;
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append_empty_list(void)
{
	struct cio_write_buffer wbh_to_split;
	cio_write_buffer_head_init(&wbh_to_split);

	struct cio_write_buffer wbh_to_append;
	cio_write_buffer_head_init(&wbh_to_append);

	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, "HELLO", sizeof("HELLO"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, "World", sizeof("World"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb2);
	size_t size_before_append = cio_write_buffer_get_total_size(&wbh_to_append);

	struct cio_write_buffer *e = &wbh_to_split;

	cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(size_before_append, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");
}